

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.cpp
# Opt level: O0

void convert<signed_char,short>(vector<unsigned_char,_std::allocator<unsigned_char>_> *src)

{
  float fVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  mapped_type *pmVar5;
  reference pvVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  float fVar7;
  int i;
  char v;
  vector<short,_std::allocator<short>_> dst;
  int n;
  allocator_type *in_stack_ffffffffffffff30;
  key_type *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  allocator_type local_68 [8];
  type_index local_60;
  type_index local_58;
  type_index local_50;
  int local_44;
  value_type local_3d;
  vector<short,_std::allocator<short>_> local_28;
  int local_c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_8;
  
  local_8 = in_RDI;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
  local_c = (int)sVar3;
  std::allocator<short>::allocator((allocator<short> *)0x110a92);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (size_type)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<short>::~allocator((allocator<short> *)0x110ab8);
  for (local_44 = 0; local_44 < local_c; local_44 = local_44 + 1) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_8,(long)local_44);
    local_3d = *pvVar4;
    iVar2 = (int)(char)local_3d;
    std::type_index::type_index(&local_50,(type_info *)&signed_char::typeinfo);
    pmVar5 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at((map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff38);
    fVar7 = *pmVar5;
    std::type_index::type_index(&local_58,(type_info *)&signed_char::typeinfo);
    pmVar5 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at((map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff44 = ((float)iVar2 - fVar7) / *pmVar5;
    std::type_index::type_index(&local_60,(type_info *)&short::typeinfo);
    pmVar5 = std::
             map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
             ::at((map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  in_stack_ffffffffffffff38);
    fVar7 = *pmVar5;
    in_stack_ffffffffffffff30 = local_68;
    std::type_index::type_index
              ((type_index *)in_stack_ffffffffffffff30,(type_info *)&short::typeinfo);
    in_stack_ffffffffffffff38 =
         (key_type *)
         std::
         map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
         ::at((map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
               *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              in_stack_ffffffffffffff38);
    fVar1 = *(float *)&in_stack_ffffffffffffff38->_M_target;
    fVar7 = in_stack_ffffffffffffff44 * fVar7;
    pvVar6 = std::vector<short,_std::allocator<short>_>::operator[](&local_28,(long)local_44);
    *pvVar6 = (value_type)(int)(fVar7 + fVar1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (size_type)in_stack_ffffffffffffff38);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_8,0);
  pvVar6 = std::vector<short,_std::allocator<short>_>::operator[](&local_28,0);
  memcpy(pvVar4,pvVar6,(long)local_c << 1);
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)in_stack_ffffffffffffff30);
  return;
}

Assistant:

void convert(std::vector<uint8_t> & src) {
    const int n = src.size()/sizeof(S);
    std::vector<D> dst(n);
    S v;
    for (int i = 0; i < n; ++i) {
        std::memcpy(&v, &src[i*sizeof(S)], sizeof(S));
        dst[i] = ((float(v) - kSampleOffset.at(typeid(S)))/kSampleScale.at(typeid(S)))*kSampleScale.at(typeid(D)) + kSampleOffset.at(typeid(D));
    }

    src.resize(n*sizeof(D));
    std::memcpy(&src[0], &dst[0], n*sizeof(D));
}